

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-list.c
# Opt level: O0

void monster_list_free(monster_list_t *list)

{
  monster_list_t *list_local;
  
  if (list != (monster_list_t *)0x0) {
    if (list->entries != (monster_list_entry_t *)0x0) {
      mem_free(list->entries);
      list->entries = (monster_list_entry_t *)0x0;
    }
    mem_free(list);
  }
  return;
}

Assistant:

void monster_list_free(monster_list_t *list)
{
	if (list == NULL)
		return;

	if (list->entries != NULL) {
		mem_free(list->entries);
		list->entries = NULL;
	}

	mem_free(list);
	list = NULL;
}